

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

int32_t run_container_read(int32_t cardinality,run_container_t *container,char *buf)

{
  ushort uVar1;
  uint uVar2;
  
  uVar1 = *(ushort *)buf;
  uVar2 = (uint)uVar1;
  container->n_runs = (uint)uVar1;
  if (container->capacity < (int)(uint)uVar1) {
    run_container_grow(container,(uint)uVar1,false);
    uVar2 = container->n_runs;
  }
  if (0 < (int)uVar2) {
    memcpy(container->runs,buf + 2,(ulong)uVar2 << 2);
    uVar2 = container->n_runs;
  }
  return uVar2 * 4 + 2;
}

Assistant:

int32_t run_container_read(int32_t cardinality, run_container_t *container,
                           const char *buf) {
    (void)cardinality;
    uint16_t cast_16;
    memcpy(&cast_16, buf, sizeof(uint16_t));
    container->n_runs = cast_16;
    if (container->n_runs > container->capacity)
        run_container_grow(container, container->n_runs, false);
    if (container->n_runs > 0) {
        memcpy(container->runs, buf + sizeof(uint16_t),
               container->n_runs * sizeof(rle16_t));
    }
    return run_container_size_in_bytes(container);
}